

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

UniquePtr<SDL_Renderer> * __thiscall
solitaire::graphics::SDLGraphicsSystemTests::makeSDLRenderer
          (UniquePtr<SDL_Renderer> *__return_storage_ptr__,SDLGraphicsSystemTests *this,
          SDL_Renderer_conflict *ptr)

{
  shared_ptr<solitaire::SDL::PtrDeleterMock> local_60;
  PtrDeleter local_50;
  function<void_(SDL_Renderer_*)> local_40;
  SDL_Renderer_conflict *local_20;
  SDL_Renderer_conflict *ptr_local;
  SDLGraphicsSystemTests *this_local;
  
  local_20 = ptr;
  ptr_local = (SDL_Renderer_conflict *)this;
  this_local = (SDLGraphicsSystemTests *)__return_storage_ptr__;
  std::shared_ptr<solitaire::SDL::PtrDeleterMock>::
  shared_ptr<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,void>
            (&local_60,&this->ptrDeleterMock);
  SDL::PtrDeleter::PtrDeleter(&local_50,&local_60);
  std::function<void(SDL_Renderer*)>::function<solitaire::SDL::PtrDeleter,void>
            ((function<void(SDL_Renderer*)> *)&local_40,&local_50);
  std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>::
  unique_ptr<std::function<void(SDL_Renderer*)>,void>
            ((unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>> *)__return_storage_ptr__,
             ptr,&local_40);
  std::function<void_(SDL_Renderer_*)>::~function(&local_40);
  SDL::PtrDeleter::~PtrDeleter(&local_50);
  std::shared_ptr<solitaire::SDL::PtrDeleterMock>::~shared_ptr(&local_60);
  return __return_storage_ptr__;
}

Assistant:

UniquePtr<SDL_Renderer> makeSDLRenderer(SDL_Renderer* ptr) {
        return UniquePtr<SDL_Renderer> {ptr, PtrDeleter {ptrDeleterMock}};
    }